

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_ghost(REF_GEOM ref_geom,REF_NODE ref_node)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  REF_MPI ref_mpi;
  REF_INT *pRVar4;
  REF_ADJ pRVar5;
  REF_DBL *pRVar6;
  REF_ADJ_ITEM pRVar7;
  uint uVar8;
  undefined4 *__ptr;
  ulong uVar9;
  undefined4 *__ptr_00;
  REF_INT *send_size;
  REF_INT *pRVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  void *pvVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  void *local_d8;
  REF_INT local;
  void *local_c8;
  void *local_c0;
  REF_INT *local_b8;
  void *local_b0;
  void *local_a8;
  REF_INT *local_a0;
  REF_GEOM local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  REF_INT *local_78;
  void *local_70;
  ulong local_68;
  void *local_60;
  REF_INT degree;
  void *local_50;
  REF_INT descr [6];
  
  ref_mpi = ref_node->ref_mpi;
  uVar18 = (ulong)ref_mpi->n;
  if ((long)uVar18 < 2) {
    return 0;
  }
  __size = uVar18 * 4;
  __ptr = (undefined4 *)malloc(__size);
  if (__ptr == (undefined4 *)0x0) {
    pcVar17 = "malloc a_next of REF_INT NULL";
    uVar14 = 0xe6a;
  }
  else {
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
      __ptr[uVar9] = 0;
    }
    __ptr_00 = (undefined4 *)malloc(__size);
    if (__ptr_00 == (undefined4 *)0x0) {
      pcVar17 = "malloc b_next of REF_INT NULL";
      uVar14 = 0xe6b;
    }
    else {
      for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
        __ptr_00[uVar9] = 0;
      }
      local_98 = ref_geom;
      send_size = (REF_INT *)malloc(__size);
      if (send_size == (REF_INT *)0x0) {
        pcVar17 = "malloc a_nnode of REF_INT NULL";
        uVar14 = 0xe6c;
      }
      else {
        for (uVar9 = 0; uVar9 < uVar18; uVar9 = uVar9 + 1) {
          send_size[uVar9] = 0;
        }
        pRVar10 = (REF_INT *)malloc(__size);
        if (pRVar10 == (REF_INT *)0x0) {
          pcVar17 = "malloc b_nnode of REF_INT NULL";
          uVar14 = 0xe6d;
        }
        else {
          for (uVar9 = 0; uVar9 < uVar18; uVar9 = uVar9 + 1) {
            pRVar10[uVar9] = 0;
          }
          local_78 = pRVar10;
          pRVar10 = (REF_INT *)malloc(__size);
          if (pRVar10 == (REF_INT *)0x0) {
            pcVar17 = "malloc a_ngeom of REF_INT NULL";
            uVar14 = 0xe6e;
          }
          else {
            for (uVar9 = 0; uVar9 < uVar18; uVar9 = uVar9 + 1) {
              pRVar10[uVar9] = 0;
            }
            local_a0 = pRVar10;
            pRVar10 = (REF_INT *)malloc(__size);
            if (pRVar10 == (REF_INT *)0x0) {
              pcVar17 = "malloc b_ngeom of REF_INT NULL";
              uVar14 = 0xe6f;
            }
            else {
              for (uVar9 = 0; uVar9 < uVar18; uVar9 = uVar9 + 1) {
                pRVar10[uVar9] = 0;
              }
              uVar9 = 0;
              uVar18 = (ulong)(uint)ref_node->max;
              if (ref_node->max < 1) {
                uVar18 = uVar9;
              }
              for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                if ((-1 < ref_node->global[uVar9]) && (ref_mpi->id != ref_node->part[uVar9])) {
                  send_size[ref_node->part[uVar9]] = send_size[ref_node->part[uVar9]] + 1;
                }
              }
              local_b8 = pRVar10;
              uVar8 = ref_mpi_alltoall(ref_mpi,send_size,local_78,1);
              if (uVar8 != 0) {
                pcVar17 = "alltoall nnodes";
                uVar14 = 0xe78;
                uVar18 = (ulong)uVar8;
LAB_0018b08b:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,uVar14,"ref_geom_ghost",uVar18,pcVar17);
                return uVar8;
              }
              uVar8 = ref_mpi->n;
              uVar18 = 0;
              uVar9 = 0;
              if (0 < (int)uVar8) {
                uVar9 = (ulong)uVar8;
              }
              pvVar11 = (void *)0x0;
              for (; uVar9 != uVar18; uVar18 = uVar18 + 1) {
                pvVar11 = (void *)(ulong)(uint)((int)pvVar11 + send_size[uVar18]);
              }
              if ((int)pvVar11 < 0) {
                pcVar17 = "malloc a_global of REF_GLOB negative";
                uVar14 = 0xe7c;
LAB_0018b195:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,uVar14,"ref_geom_ghost",pcVar17);
                return 1;
              }
              local_c0 = (void *)(long)(int)uVar8;
              local_a8 = pvVar11;
              pvVar11 = malloc((long)pvVar11 * 8);
              if (pvVar11 == (void *)0x0) {
                pcVar17 = "malloc a_global of REF_GLOB NULL";
                uVar14 = 0xe7c;
              }
              else {
                local_50 = pvVar11;
                pvVar11 = malloc((long)local_a8 << 2);
                if (pvVar11 == (void *)0x0) {
                  pcVar17 = "malloc a_part of REF_INT NULL";
                  uVar14 = 0xe7d;
                }
                else {
                  uVar8 = 0;
                  for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
                    uVar8 = uVar8 + local_78[uVar18];
                  }
                  if ((int)uVar8 < 0) {
                    pcVar17 = "malloc b_global of REF_GLOB negative";
                    uVar14 = 0xe81;
                    goto LAB_0018b195;
                  }
                  pvVar15 = (void *)(ulong)uVar8;
                  local_a8 = pvVar11;
                  pvVar11 = malloc((long)pvVar15 * 8);
                  if (pvVar11 == (void *)0x0) {
                    pcVar17 = "malloc b_global of REF_GLOB NULL";
                    uVar14 = 0xe81;
                  }
                  else {
                    local_80 = malloc((long)pvVar15 * 4);
                    pRVar10 = local_78;
                    if (local_80 != (void *)0x0) {
                      *__ptr = 0;
                      iVar13 = 0;
                      for (lVar12 = 1; lVar12 < (long)local_c0; lVar12 = lVar12 + 1) {
                        iVar13 = iVar13 + send_size[lVar12 + -1];
                        __ptr[lVar12] = iVar13;
                      }
                      uVar9 = 0;
                      uVar18 = (ulong)(uint)ref_node->max;
                      if (ref_node->max < 1) {
                        uVar18 = uVar9;
                      }
                      for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                        if (-1 < ref_node->global[uVar9]) {
                          iVar13 = ref_mpi->id;
                          pRVar4 = ref_node->part;
                          iVar1 = pRVar4[uVar9];
                          if (iVar13 != iVar1) {
                            iVar1 = __ptr[iVar1];
                            *(REF_GLOB *)((long)local_50 + (long)iVar1 * 8) =
                                 ref_node->global[uVar9];
                            *(int *)((long)local_a8 + (long)iVar1 * 4) = iVar13;
                            __ptr[pRVar4[uVar9]] = __ptr[pRVar4[uVar9]] + 1;
                          }
                        }
                      }
                      local_88 = pvVar15;
                      local_60 = pvVar11;
                      uVar8 = ref_mpi_alltoallv(ref_mpi,local_50,send_size,pvVar11,local_78,1,2);
                      if (uVar8 == 0) {
                        uVar8 = ref_mpi_alltoallv(ref_mpi,local_a8,send_size,local_80,pRVar10,1,1);
                        if (uVar8 == 0) {
                          pvVar11 = (void *)0x0;
                          while (local_88 != pvVar11) {
                            uVar8 = ref_node_local(ref_node,*(REF_GLOB *)
                                                             ((long)local_60 + (long)pvVar11 * 8),
                                                   &local);
                            if (uVar8 != 0) {
                              uVar18 = (ulong)uVar8;
                              pcVar17 = "g2l";
                              uVar14 = 0xe9a;
                              goto LAB_0018b3bc;
                            }
                            iVar13 = *(int *)((long)local_80 + (long)pvVar11 * 4);
                            local_c0 = pvVar11;
                            uVar8 = ref_adj_degree(local_98->ref_adj,local,&degree);
                            if (uVar8 != 0) {
                              uVar18 = (ulong)uVar8;
                              pcVar17 = "deg";
                              uVar14 = 0xe9c;
                              goto LAB_0018b3bc;
                            }
                            local_b8[iVar13] = local_b8[iVar13] + degree;
                            pvVar11 = (void *)((long)local_c0 + 1);
                          }
                          uVar8 = ref_mpi_alltoall(ref_mpi,local_b8,local_a0,1);
                          if (uVar8 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                   ,0xea3,"ref_geom_ghost",(ulong)uVar8,"alltoall ngeoms");
                            return uVar8;
                          }
                          uVar8 = ref_mpi->n;
                          local_b0 = (void *)(long)(int)uVar8;
                          uVar18 = 0;
                          uVar9 = 0;
                          if (0 < (int)uVar8) {
                            uVar9 = (ulong)uVar8;
                          }
                          local_68 = 0;
                          for (; iVar13 = (int)local_68, uVar9 != uVar18; uVar18 = uVar18 + 1) {
                            local_68 = (ulong)(uint)(iVar13 + local_a0[uVar18]);
                          }
                          if (iVar13 < 0) {
                            pcVar17 = "malloc a_descr of REF_GLOB negative";
                            uVar14 = 0xea7;
                            goto LAB_0018b195;
                          }
                          local_90 = malloc((ulong)(uint)(iVar13 * 6) << 3);
                          if (local_90 == (void *)0x0) {
                            pcVar17 = "malloc a_descr of REF_GLOB NULL";
                            uVar14 = 0xea7;
                            goto LAB_0018b0d8;
                          }
                          local_70 = malloc((ulong)(uint)((int)local_68 * 2) << 3);
                          if (local_70 == (void *)0x0) {
                            pcVar17 = "malloc a_param of REF_DBL NULL";
                            uVar14 = 0xea8;
                            goto LAB_0018b0d8;
                          }
                          local_c8 = (void *)0x0;
                          for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
                            local_c8 = (void *)(ulong)(uint)((int)local_c8 + local_b8[uVar18]);
                          }
                          if ((int)local_c8 < 0) {
                            pcVar17 = "malloc b_descr of REF_GLOB negative";
                            uVar14 = 0xeac;
                            goto LAB_0018b195;
                          }
                          local_c0 = malloc((ulong)(uint)((int)local_c8 * 6) << 3);
                          if (local_c0 == (void *)0x0) {
                            pcVar17 = "malloc b_descr of REF_GLOB NULL";
                            uVar14 = 0xeac;
                            goto LAB_0018b0d8;
                          }
                          local_c8 = malloc((ulong)(uint)((int)local_c8 * 2) << 3);
                          if (local_c8 == (void *)0x0) {
                            pcVar17 = "malloc b_param of REF_DBL NULL";
                            uVar14 = 0xead;
                            local_c8 = (void *)0x0;
                            goto LAB_0018b0d8;
                          }
                          *__ptr_00 = 0;
                          iVar13 = 0;
                          for (lVar12 = 1; lVar12 < (long)local_b0; lVar12 = lVar12 + 1) {
                            iVar13 = iVar13 + local_b8[lVar12 + -1];
                            __ptr_00[lVar12] = iVar13;
                          }
                          for (local_b0 = (void *)0x0; local_b0 != local_88;
                              local_b0 = (void *)((long)local_b0 + 1)) {
                            uVar8 = ref_node_local(ref_node,*(REF_GLOB *)
                                                             ((long)local_60 + (long)local_b0 * 8),
                                                   &local);
                            if (uVar8 != 0) {
                              uVar18 = (ulong)uVar8;
                              pcVar17 = "g2l";
                              uVar14 = 0xeb5;
                              goto LAB_0018b3bc;
                            }
                            iVar13 = -1;
                            uVar18 = 0xffffffff;
                            if (-1 < (long)local) {
                              pRVar5 = local_98->ref_adj;
                              iVar13 = -1;
                              uVar18 = 0xffffffff;
                              if (local < pRVar5->nnode) {
                                uVar8 = pRVar5->first[local];
                                iVar13 = -1;
                                uVar18 = 0xffffffff;
                                if ((long)(int)uVar8 != -1) {
                                  iVar13 = pRVar5->item[(int)uVar8].ref;
                                  uVar18 = (ulong)uVar8;
                                }
                              }
                            }
                            iVar1 = *(int *)((long)local_80 + (long)local_b0 * 4);
                            while ((int)uVar18 != -1) {
                              pRVar10 = local_98->descr;
                              iVar2 = __ptr_00[iVar1];
                              for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                                *(long *)((long)local_c0 + lVar12 * 8 + (long)(iVar2 * 6) * 8) =
                                     (long)pRVar10[iVar13 * 6 + lVar12];
                              }
                              iVar3 = pRVar10[(long)(iVar13 * 6) + 5];
                              lVar12 = -1;
                              lVar16 = lVar12;
                              if (((-1 < (long)iVar3) && (iVar3 < ref_node->max)) &&
                                 (lVar16 = ref_node->global[iVar3], ref_node->global[iVar3] < 0)) {
                                lVar16 = lVar12;
                              }
                              *(long *)((long)local_c0 + (long)(iVar2 * 6) * 8 + 0x28) = lVar16;
                              pRVar6 = local_98->param;
                              *(REF_DBL *)((long)local_c8 + (long)iVar2 * 0x10) = pRVar6[iVar13 * 2]
                              ;
                              *(REF_DBL *)((long)local_c8 + (long)(iVar2 * 2 + 1) * 8) =
                                   pRVar6[iVar13 * 2 + 1];
                              __ptr_00[iVar1] = iVar2 + 1;
                              pRVar7 = local_98->ref_adj->item;
                              uVar18 = (ulong)pRVar7[(int)uVar18].next;
                              iVar13 = -1;
                              if (uVar18 != 0xffffffffffffffff) {
                                iVar13 = pRVar7[uVar18].ref;
                              }
                            }
                          }
                          uVar8 = ref_mpi_alltoallv(ref_mpi,local_c0,local_b8,local_90,local_a0,6,2)
                          ;
                          if (uVar8 == 0) {
                            uVar8 = ref_mpi_alltoallv(ref_mpi,local_c8,local_b8,local_70,local_a0,2,
                                                      3);
                            if (uVar8 == 0) {
                              local_88 = (void *)(local_68 & 0xffffffff);
                              local_d8 = (void *)0x0;
                              pvVar11 = local_90;
                              do {
                                if (local_d8 == local_88) {
                                  free(local_c8);
                                  free(local_c0);
                                  free(local_70);
                                  free(local_90);
                                  free(local_80);
                                  free(local_60);
                                  free(local_a8);
                                  free(local_50);
                                  free(local_b8);
                                  free(local_a0);
                                  free(local_78);
                                  free(send_size);
                                  free(__ptr_00);
                                  free(__ptr);
                                  return 0;
                                }
                                for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                                  descr[lVar12] = *(REF_INT *)((long)pvVar11 + lVar12 * 8);
                                }
                                uVar8 = ref_node_local(ref_node,*(REF_GLOB *)
                                                                 ((long)local_90 +
                                                                 (long)local_d8 * 0x30 + 0x28),
                                                       &local);
                                if (uVar8 != 0) {
                                  uVar18 = (ulong)uVar8;
                                  pcVar17 = "g2l";
                                  uVar14 = 0xed0;
                                  goto LAB_0018b3bc;
                                }
                                descr[5] = local;
                                uVar8 = ref_geom_add_with_descr
                                                  (local_98,descr,
                                                   (REF_DBL *)
                                                   ((long)local_d8 * 0x10 + (long)local_70));
                                local_d8 = (void *)((long)local_d8 + 1);
                                pvVar11 = (void *)((long)pvVar11 + 0x30);
                              } while (uVar8 == 0);
                              uVar18 = (ulong)uVar8;
                              pcVar17 = "add ghost";
                              uVar14 = 0xed3;
                            }
                            else {
                              uVar18 = (ulong)uVar8;
                              pcVar17 = "alltoallv param";
                              uVar14 = 0xec9;
                            }
                          }
                          else {
                            uVar18 = (ulong)uVar8;
                            pcVar17 = "alltoallv descr";
                            uVar14 = 0xec6;
                          }
                        }
                        else {
                          uVar18 = (ulong)uVar8;
                          pcVar17 = "alltoallv global";
                          uVar14 = 0xe97;
                        }
                      }
                      else {
                        uVar18 = (ulong)uVar8;
                        pcVar17 = "alltoallv global";
                        uVar14 = 0xe94;
                      }
LAB_0018b3bc:
                      uVar8 = (uint)uVar18;
                      goto LAB_0018b08b;
                    }
                    pcVar17 = "malloc b_part of REF_INT NULL";
                    uVar14 = 0xe82;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0018b0d8:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar14,
         "ref_geom_ghost",pcVar17);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_ghost(REF_GEOM ref_geom, REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ngeom, *b_ngeom;
  REF_INT a_ngeom_total, b_ngeom_total;
  REF_GLOB *a_descr, *b_descr;
  REF_GLOB global;
  REF_DBL *a_param, *b_param;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, item, geom, i;
  REF_INT descr[REF_GEOM_DESCR_SIZE];

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv global");

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    RSS(ref_adj_degree(ref_geom_adj(ref_geom), local, &degree), "deg");
    /* printf("%d: node %d global %d local %d part %d degree %d\n",
       ref_mpi_rank(ref_mpi), node,b_global[node], local, part, degree); */
    b_ngeom[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ngeom, a_ngeom, REF_INT_TYPE),
      "alltoall ngeoms");

  a_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ngeom_total += a_ngeom[part];
  ref_malloc(a_descr, REF_GEOM_DESCR_SIZE * a_ngeom_total, REF_GLOB);
  ref_malloc(a_param, 2 * a_ngeom_total, REF_DBL);

  b_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ngeom_total += b_ngeom[part];
  ref_malloc(b_descr, REF_GEOM_DESCR_SIZE * b_ngeom_total, REF_GLOB);
  ref_malloc(b_param, 2 * b_ngeom_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ngeom[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    each_ref_geom_having_node(ref_geom, local, item, geom) {
      each_ref_descr(ref_geom, i) {
        b_descr[i + REF_GEOM_DESCR_SIZE * b_next[part]] =
            (REF_GLOB)ref_geom_descr(ref_geom, i, geom);
      }
      b_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * b_next[part]] =
          ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
      b_param[0 + 2 * b_next[part]] = ref_geom_param(ref_geom, 0, geom);
      b_param[1 + 2 * b_next[part]] = ref_geom_param(ref_geom, 1, geom);
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_descr, b_ngeom, a_descr, a_ngeom,
                        REF_GEOM_DESCR_SIZE, REF_GLOB_TYPE),
      "alltoallv descr");
  RSS(ref_mpi_alltoallv(ref_mpi, b_param, b_ngeom, a_param, a_ngeom, 2,
                        REF_DBL_TYPE),
      "alltoallv param");

  for (geom = 0; geom < a_ngeom_total; geom++) {
    each_ref_descr(ref_geom, i) {
      descr[i] = (REF_INT)a_descr[i + REF_GEOM_DESCR_SIZE * geom];
    }
    global = a_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * geom];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    descr[REF_GEOM_DESCR_NODE] = local;
    RSS(ref_geom_add_with_descr(ref_geom, descr, &(a_param[2 * geom])),
        "add ghost");
  }

  free(b_param);
  free(b_descr);
  free(a_param);
  free(a_descr);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ngeom);
  free(a_ngeom);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}